

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl.cpp
# Opt level: O2

int __thiscall arbiter::http::Curl::perform(Curl *this)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  int iVar4;
  long httpCode;
  undefined8 local_20;
  
  local_20 = 0;
  iVar1 = curl_easy_perform(this->m_curl);
  curl_easy_getinfo(this->m_curl,0x200002,&local_20);
  curl_easy_reset(this->m_curl);
  if (iVar1 == 0) {
    iVar4 = (int)local_20;
  }
  else {
    iVar4 = 0x226;
    if (this->m_verbose == true) {
      poVar2 = ::std::operator<<((ostream *)&::std::cout,"Curl failure: ");
      pcVar3 = (char *)curl_easy_strerror(iVar1);
      poVar2 = ::std::operator<<(poVar2,pcVar3);
      ::std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  return iVar4;
}

Assistant:

int Curl::perform()
{
#ifdef ARBITER_CURL
    long httpCode(0);

    const auto code(curl_easy_perform(m_curl));
    curl_easy_getinfo(m_curl, CURLINFO_RESPONSE_CODE, &httpCode);
    curl_easy_reset(m_curl);

    if (code != CURLE_OK)
    {
        if (m_verbose)
        {
            std::cout << "Curl failure: " << curl_easy_strerror(code) << 
                std::endl;
        }
        httpCode = 550;
    }

    return httpCode;
#else
    throw ArbiterError(fail);
#endif
}